

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool EthBasePort::CheckDebugHeader(ostream *debugStream,string *caller,char *header,uint version)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (((*header == 'D') && (header[1] == 'B')) && (header[2] == 'G')) {
    if (header[3] == 0x30) {
      poVar1 = std::operator<<(debugStream,(string *)caller);
      pcVar2 = ": No debug data available";
    }
    else {
      if ((int)header[3] - 0x30U == version) {
        return true;
      }
      poVar1 = std::operator<<(debugStream,(string *)caller);
      poVar1 = std::operator<<(poVar1,": Unsupported debug level: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1," (must be ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar2 = ")";
    }
  }
  else {
    poVar1 = std::operator<<(debugStream,(string *)caller);
    poVar1 = std::operator<<(poVar1,": Unexpected header string: ");
    poVar1 = std::operator<<(poVar1,*header);
    poVar1 = std::operator<<(poVar1,header[1]);
    poVar1 = std::operator<<(poVar1,header[2]);
    pcVar2 = " (should be DBG)";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return false;
}

Assistant:

bool EthBasePort::CheckDebugHeader(std::ostream &debugStream, const std::string &caller, const char *header,
                                   unsigned int version)
{
    if (strncmp(header, "DBG", 3) != 0) {
        debugStream << caller << ": Unexpected header string: " << header[0] << header[1]
                    << header[2] << " (should be DBG)" << std::endl;
        return false;
    }
    unsigned int debugLevel = header[3] - '0';
    if (debugLevel == 0) {
        debugStream << caller << ": No debug data available" << std::endl;
        return false;
    }
    // Introduced debugLevel 2 with Firmware V8. Use an older version of this software for
    // earlier versions of firmware.
    else if (debugLevel != version) {
        debugStream << caller << ": Unsupported debug level: " << debugLevel << " (must be "
                    << version << ")" << std::endl;
        return false;
    }
    return true;
}